

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O2

void fiobj_dealloc_task(FIOBJ o,void *stack_)

{
  int *piVar1;
  fiobj_object_vtable_s *pfVar2;
  uintptr_t uVar3;
  
  if ((((~(uint)o & 6) != 0) && (o != 0)) && ((o & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((o & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pfVar2 = fiobj_type_vtable(o);
      if (pfVar2->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
        uVar3 = (*pfVar2->count)(o);
        if (uVar3 != 0) {
          fiobj_stack_push((fiobj_stack_s *)stack_,o);
          return;
        }
      }
      pfVar2 = fiobj_type_vtable(o);
      (*pfVar2->dealloc)(o,(_func_void_FIOBJ_void_ptr *)0x0,(void *)0x0);
      return;
    }
  }
  return;
}

Assistant:

static void fiobj_dealloc_task(FIOBJ o, void *stack_) {
  // if (!o)
  //   fprintf(stderr, "* WARN: freeing a NULL no-object\n");
  // else
  //   fprintf(stderr, "* freeing object %s\n", fiobj_obj2cstr(o).data);
  if (!o || !FIOBJ_IS_ALLOCATED(o))
    return;
  if (OBJREF_REM(o))
    return;
  if (!FIOBJECT2VTBL(o)->each || !FIOBJECT2VTBL(o)->count(o)) {
    FIOBJECT2VTBL(o)->dealloc(o, NULL, NULL);
    return;
  }
  fiobj_stack_s *s = stack_;
  fiobj_stack_push(s, o);
}